

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::DisableIffAssertionExpr::fromSyntax
          (DisableIffSyntax *syntax,AssertionExpr *expr,ASTContext *context)

{
  SourceRange sourceRange;
  Compilation *pCVar1;
  SourceLocation expr_00;
  DisableIffAssertionExpr *pDVar2;
  AssertionExpr *in_RDX;
  undefined8 in_RDI;
  ASTContext *unaff_retaddr;
  ExpressionSyntax *in_stack_00000008;
  Expression *cond;
  Compilation *comp;
  AssertionExpr *in_stack_ffffffffffffffb0;
  SourceRange in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 isFutureGlobal;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  DiagCode code;
  undefined2 uVar6;
  
  isFutureGlobal = (undefined1)((uint)in_stack_ffffffffffffffcc >> 0x18);
  uVar6 = (undefined2)((ulong)in_RDI >> 0x30);
  pCVar1 = ASTContext::getCompilation((ASTContext *)0xb4263d);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xb42650);
  expr_00 = (SourceLocation)
            bindExpr(in_stack_00000008,unaff_retaddr,SUB21((ushort)uVar6 >> 8,0),SUB21(uVar6,0));
  uVar5 = 0x150008;
  uVar4 = 0x160008;
  AssertionExpr::checkSampledValueExpr
            ((Expression *)expr_00,(ASTContext *)0x15000800160008,(bool)isFutureGlobal,
             SUB84((ulong)pCVar1 >> 0x20,0),SUB84(pCVar1,0));
  code = SUB84((ulong)pCVar1 >> 0x20,0);
  if ((*(long *)(in_RDX + 3) != 0) && ((*(byte *)(*(long *)(in_RDX + 3) + 0x88) & 1) != 0)) {
    uVar3 = 0x3d0008;
    in_stack_ffffffffffffffb8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)unaff_retaddr);
    sourceRange.startLoc._4_4_ = uVar5;
    sourceRange.startLoc._0_4_ = uVar4;
    sourceRange.endLoc = expr_00;
    ASTContext::addDiag((ASTContext *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),code,sourceRange);
    in_stack_ffffffffffffffb0 = in_RDX;
  }
  pDVar2 = BumpAllocator::
           emplace<slang::ast::DisableIffAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&>
                     ((BumpAllocator *)in_stack_ffffffffffffffb8.endLoc,
                      (Expression *)in_stack_ffffffffffffffb8.startLoc,in_stack_ffffffffffffffb0);
  return &pDVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& DisableIffAssertionExpr::fromSyntax(const DisableIffSyntax& syntax,
                                                   const AssertionExpr& expr,
                                                   const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.expr, context);

    checkSampledValueExpr(cond, context, false, diag::DisableIffLocalVar, diag::DisableIffMatched);

    if (context.assertionInstance && context.assertionInstance->isRecursive)
        context.addDiag(diag::RecursivePropDisableIff, syntax.sourceRange());

    return *comp.emplace<DisableIffAssertionExpr>(cond, expr);
}